

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlUCSIsCJKSymbolsandPunctuation(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined4 local_30;
  int local_2c;
  int code;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlUCSIsCJKSymbolsandPunctuation");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT(py_retval,"i:xmlUCSIsCJKSymbolsandPunctuation",&local_30);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      local_2c = xmlUCSIsCJKSymbolsandPunctuation(local_30);
      self_local = libxml_intWrap(local_2c);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlUCSIsCJKSymbolsandPunctuation(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    int code;

    if (libxml_deprecationWarning("xmlUCSIsCJKSymbolsandPunctuation") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"i:xmlUCSIsCJKSymbolsandPunctuation", &code))
        return(NULL);

    c_retval = xmlUCSIsCJKSymbolsandPunctuation(code);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}